

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

char * __thiscall IR::Instr::GetBailOutKindName(Instr *this)

{
  byte bVar1;
  BailOutKind kind;
  BailOutKind BVar2;
  char *pcVar3;
  
  bVar1 = this->field_0x38;
  kind = BailOutInvalid;
  if ((bVar1 & 0x10) != 0) {
    kind = GetBailOutKind(this);
    bVar1 = this->field_0x38;
  }
  if ((bVar1 & 0x40) != 0) {
    BVar2 = GetAuxBailOutKind(this);
    kind = kind | BVar2;
  }
  pcVar3 = ::GetBailOutKindName(kind);
  return pcVar3;
}

Assistant:

const char *
Instr::GetBailOutKindName() const
{
    IR::BailOutKind kind = (IR::BailOutKind)0;
    if (this->HasBailOutInfo())
    {
        kind |= this->GetBailOutKind();
    }
    if (this->HasAuxBailOut())
    {
        kind |= this->GetAuxBailOutKind();
    }

    return ::GetBailOutKindName(kind);
}